

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GammaHandler.cpp
# Opt level: O0

double __thiscall
GammaHandler::photoIonization
          (GammaHandler *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *sourceInfo,vector<double,_std::allocator<double>_> *xyTry)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  size_type sVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  vector<double,_std::allocator<double>_> *pvVar8;
  double extraout_XMM0_Qa;
  double pp;
  double co;
  double pe;
  double br;
  double initialEnergy;
  int i;
  bool found;
  size_t index;
  vector<double,_std::allocator<double>_> *xyTry_local;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *sourceInfo_local;
  GammaHandler *this_local;
  
  _i = 0;
  bVar4 = false;
  initialEnergy._0_4_ = 0;
  while( true ) {
    sVar5 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::size(sourceInfo);
    if (sVar5 <= (ulong)(long)initialEnergy._0_4_) break;
    pvVar6 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[](sourceInfo,(long)initialEnergy._0_4_);
    std::vector<double,_std::allocator<double>_>::operator[](pvVar6,0);
    pvVar8 = xyTry;
    std::vector<double,_std::allocator<double>_>::operator[](xyTry,0);
    std::abs((int)pvVar8);
    if (extraout_XMM0_Qa < brThresh) {
      _i = (size_type)initialEnergy._0_4_;
      bVar4 = true;
    }
    initialEnergy._0_4_ = initialEnergy._0_4_ + 1;
  }
  pvVar6 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](sourceInfo,_i);
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,1);
  dVar1 = *pvVar7;
  pvVar6 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](sourceInfo,_i);
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,2);
  dVar2 = *pvVar7;
  pvVar6 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](sourceInfo,_i);
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,3);
  dVar3 = *pvVar7;
  pvVar6 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[](sourceInfo,_i);
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](pvVar6,4);
  if (bVar4) {
    this_local = (GammaHandler *)(yMax * dVar1 * (dVar2 / (dVar2 + dVar3 + *pvVar7)));
  }
  else {
    this_local = (GammaHandler *)0x0;
  }
  return (double)this_local;
}

Assistant:

double GammaHandler::photoIonization(const vector<vector<double>>& sourceInfo,
                                     const vector<double>& xyTry) {
  // implement simple delta function to the spectrum
  std::size_t index{0};
  bool found = false;
  for (int i = 0; i < sourceInfo.size(); i++) {
    double initialEnergy = sourceInfo[i][0];
    if (abs(xyTry[0] - initialEnergy) < brThresh) {
      index = i;
      found = true;
    }
  }
  double br = sourceInfo[index][1];
  double pe = sourceInfo[index][2];
  double co = sourceInfo[index][3];
  double pp = sourceInfo[index][4];
  if (found) return yMax * br * (pe / (pe + co + pp));
  return 0.0;
}